

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

void diag(char *s1,char *s2)

{
  long in_RSI;
  undefined8 in_RDI;
  char *cp;
  char *local_18;
  
  fprintf(_stderr,"%s",in_RDI);
  if (in_RSI != 0) {
    fprintf(_stderr,"%s",in_RSI);
  }
  if (fin != (FILE *)0x0) {
    fprintf(_stderr," at line %d in file %s\n",(ulong)(uint)linenum,finname);
    fprintf(_stderr,"%s",inlinep);
    if (inlinep <= ctp) {
      for (local_18 = inlinep; local_18 < ctp + -1; local_18 = local_18 + 1) {
        if (*local_18 == '\t') {
          fprintf(_stderr,"\t");
        }
        else {
          fprintf(_stderr," ");
        }
      }
      fprintf(_stderr,"^");
    }
  }
  fprintf(_stderr,"\n");
  exit(1);
}

Assistant:

void diag(s1, s2)
	char           *s1, *s2;
{
	char           *cp;
	Fprintf(stderr, "%s", s1);
	if (s2) {
		Fprintf(stderr, "%s", s2);
	}
	if (fin) {
		Fprintf(stderr, " at line %d in file %s\n", linenum, finname);
		Fprintf(stderr, "%s", inlinep);
		if (ctp >= inlinep) {
			for (cp = inlinep; cp < ctp - 1; cp++) {
				if (*cp == '\t') {
					Fprintf(stderr, "\t");
				} else {
					Fprintf(stderr, " ");
				}
			}
			Fprintf(stderr, "^");
		}
	}
	Fprintf(stderr, "\n");
#if MAC && TARGET_API_MAC_CARBON
	SIOUXSettings.autocloseonquit = true;
	RunApplicationEventLoop();
#endif
	exit(1);
}